

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall TextEntry::maybe_scroll(TextEntry *this)

{
  Theme *pTVar1;
  ALLEGRO_FONT *pAVar2;
  int iVar3;
  int iVar4;
  UString local_40;
  
  iVar3 = this->cursor_pos;
  iVar4 = this->left_pos;
  if (iVar3 < iVar4 + 3) {
    iVar4 = 0;
    if (2 < iVar3) {
      iVar4 = iVar3 + -3;
    }
    this->left_pos = iVar4;
  }
  else {
    pTVar1 = ((this->super_Widget).dialog)->theme;
    while( true ) {
      pAVar2 = pTVar1->font;
      anon_unknown.dwarf_9dc6::UString::UString(&local_40,this->text,iVar4,iVar3);
      iVar3 = al_get_ustr_width(pAVar2,local_40.ustr);
      if (iVar3 + (this->super_Widget).x1 + 8 < (this->super_Widget).x2) break;
      al_ustr_next(this->text,&this->left_pos);
      iVar3 = this->cursor_pos;
      iVar4 = this->left_pos;
    }
  }
  return;
}

Assistant:

void TextEntry::maybe_scroll()
{
   const Theme & theme = dialog->get_theme();

   if (cursor_pos < left_pos + 3) {
      if (cursor_pos < 3)
         left_pos = 0;
      else
         left_pos = cursor_pos - 3;
   }
   else {
      for (;;) {
         const int tw = al_get_ustr_width(theme.font,
            UString(text, left_pos, cursor_pos));
         if (x1 + tw + CURSOR_WIDTH < x2) {
            break;
         }
         al_ustr_next(text, &left_pos);
      }
   }
}